

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_can_test.cpp
# Opt level: O2

ssize_t __thiscall SocketCAN::Writer::send(Writer *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ulong uVar1;
  undefined8 *__n_00;
  void *__buf_00;
  void *extraout_RDX;
  void *__buf_01;
  size_t ii;
  ulong uVar2;
  undefined4 in_register_00000034;
  ulong __n_01;
  can_frame frame;
  undefined8 local_48;
  undefined8 auStack_40 [2];
  
  __n_00 = auStack_40;
  auStack_40[0] = 0;
  uVar1 = (ulong)this->_id;
  local_48._0_5_ = CONCAT14(8,this->_id);
  local_48 = (ulong)(uint5)local_48;
  __buf_00 = __buf;
  for (uVar2 = 0; (ulong)__buf >> 3 != uVar2; uVar2 = uVar2 + 1) {
    auStack_40[0] = *(undefined8 *)(CONCAT44(in_register_00000034,__fd) + uVar2 * 8);
    uVar1 = Socket::write(&this->_socket,(int)&local_48,__buf_00,(size_t)__n_00);
    __buf_00 = extraout_RDX;
  }
  __n_01 = (ulong)__buf & 7;
  if (__n_01 != 0) {
    local_48._0_5_ = CONCAT14((char)__n_01,(undefined4)local_48);
    memcpy(auStack_40,(void *)(CONCAT44(in_register_00000034,__fd) + uVar2 * 8),__n_01);
    uVar1 = Socket::write(&this->_socket,(int)&local_48,__buf_01,(size_t)__n_00);
  }
  return uVar1;
}

Assistant:

void send(const __u8* data, size_t size) {
    struct can_frame frame{0};
    const size_t     maxDataLen = CAN_MAX_DLEN;

    const size_t fullDataFrameNumb = size/CAN_MAX_DLEN;
    const size_t lastDataFrameSize = size%CAN_MAX_DLEN;
    const __u8* srcDataPtr = data;

    frame.can_id  = _id;
    frame.can_dlc = static_cast<__u8>(maxDataLen);
    for (size_t ii = 0; ii < fullDataFrameNumb; ++ii) {
      memcpy(frame.data, srcDataPtr, maxDataLen);
      _socket.write(&frame);
      srcDataPtr += maxDataLen;
    }

    if (lastDataFrameSize > 0) {
      frame.can_dlc = static_cast<__u8>(lastDataFrameSize);
      memcpy(frame.data, srcDataPtr, lastDataFrameSize);
      _socket.write(&frame);
    }

  }